

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XTemplateSerializer.cpp
# Opt level: O1

void xercesc_4_0::XTemplateSerializer::loadObject
               (RefVectorOf<xercesc_4_0::IdentityConstraint> **objToLoad,int initSize,bool toAdopt,
               XSerializeEngine *serEng)

{
  bool bVar1;
  MemoryManager *pMVar2;
  BaseRefVectorOf<xercesc_4_0::IdentityConstraint> *pBVar3;
  IdentityConstraint *pIVar4;
  XMLSize_t XVar5;
  ulong uVar6;
  XMLSize_t vectorLength;
  XMLSize_t local_38;
  
  bVar1 = XSerializeEngine::needToLoadObject(serEng,objToLoad);
  if (bVar1) {
    if (*objToLoad == (RefVectorOf<xercesc_4_0::IdentityConstraint> *)0x0) {
      pMVar2 = XSerializeEngine::getMemoryManager(serEng);
      pBVar3 = (BaseRefVectorOf<xercesc_4_0::IdentityConstraint> *)
               XMemory::operator_new(0x30,pMVar2);
      pMVar2 = XSerializeEngine::getMemoryManager(serEng);
      XVar5 = 0x10;
      if (-1 < initSize) {
        XVar5 = (XMLSize_t)(uint)initSize;
      }
      BaseRefVectorOf<xercesc_4_0::IdentityConstraint>::BaseRefVectorOf(pBVar3,XVar5,toAdopt,pMVar2)
      ;
      pBVar3->_vptr_BaseRefVectorOf = (_func_int **)&PTR__RefVectorOf_00416290;
      *objToLoad = (RefVectorOf<xercesc_4_0::IdentityConstraint> *)pBVar3;
    }
    XSerializeEngine::registerObject(serEng,*objToLoad);
    local_38 = 0;
    XSerializeEngine::readSize(serEng,&local_38);
    if (local_38 != 0) {
      uVar6 = 0;
      do {
        pIVar4 = IdentityConstraint::loadIC(serEng);
        pBVar3 = &(*objToLoad)->super_BaseRefVectorOf<xercesc_4_0::IdentityConstraint>;
        BaseRefVectorOf<xercesc_4_0::IdentityConstraint>::ensureExtraCapacity(pBVar3,1);
        XVar5 = pBVar3->fCurCount;
        pBVar3->fElemList[XVar5] = pIVar4;
        pBVar3->fCurCount = XVar5 + 1;
        uVar6 = uVar6 + 1;
      } while (uVar6 < local_38);
    }
  }
  return;
}

Assistant:

void XTemplateSerializer::loadObject(RefVectorOf<IdentityConstraint>** objToLoad
                                   , int                                initSize
                                   , bool                               toAdopt
                                   , XSerializeEngine&                  serEng)
{

    if (serEng.needToLoadObject((void**)objToLoad))
    {
        if (!*objToLoad)
        {
            if (initSize < 0)
                initSize = 16;

            *objToLoad = new (serEng.getMemoryManager())
                             RefVectorOf<IdentityConstraint>(
                                                             initSize
                                                           , toAdopt
                                                           , serEng.getMemoryManager()
                                                            );
        }

        serEng.registerObject(*objToLoad);

        XMLSize_t vectorLength = 0;
        serEng.readSize (vectorLength);
        for (XMLSize_t i = 0 ; i < vectorLength; i++)
        {
            IdentityConstraint*  data;
            data = IdentityConstraint::loadIC(serEng);
            (*objToLoad)->addElement(data);
        }
    }

}